

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

size_t Curl_bufq_len(bufq *q)

{
  size_t sVar1;
  
  sVar1 = 0;
  while (q = (bufq *)q->head, q != (bufq *)0x0) {
    sVar1 = (long)q->pool + (sVar1 - (long)q->spare);
  }
  return sVar1;
}

Assistant:

size_t Curl_bufq_len(const struct bufq *q)
{
  const struct buf_chunk *chunk = q->head;
  size_t len = 0;
  while(chunk) {
    len += chunk_len(chunk);
    chunk = chunk->next;
  }
  return len;
}